

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommychain.h
# Opt level: O0

void tommy_chain_splice(tommy_node *first_before,tommy_node *first_after,tommy_node *second_head,
                       tommy_node *second_tail)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_node *second_tail_local;
  tommy_node *second_head_local;
  tommy_node *first_after_local;
  tommy_node *first_before_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  first_after->prev = second_tail;
  second_head->prev = first_before;
  first_before->next = second_head;
  second_tail->next = first_after;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_chain_splice(tommy_node* first_before, tommy_node* first_after, tommy_node* second_head, tommy_node* second_tail)
{
	/* set the prev list */
	first_after->prev = second_tail;
	second_head->prev = first_before;

	/* set the next list */
	first_before->next = second_head;
	second_tail->next = first_after;
}